

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MegaBoy.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::MegaBoy::perform_bus_operation
          (MegaBoy *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t *value_local;
  uint16_t address_local;
  BusOperation operation_local;
  MegaBoy *this_local;
  
  if ((address & 0x1000) != 0) {
    if ((address & 0x1fff) == 0x1ff0) {
      this->current_page_ = this->current_page_ + 1 & 0xf;
      this->rom_ptr_ = (this->super_BusExtender).rom_base_ + (int)((uint)this->current_page_ << 0xc)
      ;
    }
    if ((int)operation < 5) {
      *value = this->rom_ptr_[(int)((address & 0x1fff) & 0xfff)];
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address == 0x1ff0) {
				current_page_ = (current_page_ + 1) & 15;
				rom_ptr_ = rom_base_ + current_page_ * 4096;
			}

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}
		}